

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall sznet::net::TcpConnection::~TcpConnection(TcpConnection *this)

{
  _Atomic_word *p_Var1;
  ulong __n;
  pointer pcVar2;
  _Manager_type p_Var3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  LogStream *pLVar6;
  char **ppcVar7;
  char *pcVar8;
  int iVar9;
  SourceFile file;
  Logger local_ff0;
  
  if (g_logLevel < 2) {
    file._8_8_ = 0x11;
    file.m_data = "TcpConnection.cpp";
    Logger::Logger(&local_ff0,file,0x3a,DEBUG,"~TcpConnection");
    iVar9 = (int)&local_ff0.m_impl.m_stream.m_buffer.m_cur;
    if (0x14 < (uint)(iVar9 - (int)local_ff0.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_ff0.m_impl.m_stream.m_buffer.m_cur,"TcpConnection::dtor[",0x14);
      local_ff0.m_impl.m_stream.m_buffer.m_cur = local_ff0.m_impl.m_stream.m_buffer.m_cur + 0x14;
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(iVar9 - (int)local_ff0.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_ff0.m_impl.m_stream.m_buffer.m_cur,(this->m_name)._M_dataplus._M_p,__n);
      local_ff0.m_impl.m_stream.m_buffer.m_cur = local_ff0.m_impl.m_stream.m_buffer.m_cur + __n;
    }
    if (5 < (uint)(iVar9 - (int)local_ff0.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_ff0.m_impl.m_stream.m_buffer.m_cur,"] at ",5);
      local_ff0.m_impl.m_stream.m_buffer.m_cur = local_ff0.m_impl.m_stream.m_buffer.m_cur + 5;
    }
    pLVar6 = LogStream::operator<<(&local_ff0.m_impl.m_stream,this);
    ppcVar7 = &(pLVar6->m_buffer).m_cur;
    pcVar8 = (pLVar6->m_buffer).m_cur;
    if (4 < (uint)((int)ppcVar7 - (int)pcVar8)) {
      builtin_strncpy(pcVar8," fd=",4);
      *ppcVar7 = *ppcVar7 + 4;
    }
    pLVar6 = LogStream::operator<<
                       (pLVar6,((this->m_channel)._M_t.
                                super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                                .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->
                               m_fd);
    ppcVar7 = &(pLVar6->m_buffer).m_cur;
    pcVar8 = (pLVar6->m_buffer).m_cur;
    if (((int)ppcVar7 - (int)pcVar8 & 0xfffffff8U) != 0) {
      builtin_strncpy(pcVar8," state=",7);
      *ppcVar7 = *ppcVar7 + 7;
    }
    if ((ulong)this->m_state < 4) {
      pcVar8 = *(char **)(&DAT_00149b58 + (ulong)this->m_state * 8);
    }
    else {
      pcVar8 = "unknown state";
    }
    LogStream::operator<<(pLVar6,pcVar8);
    Logger::~Logger(&local_ff0);
  }
  if (this->m_state == kDisconnected) {
    pcVar2 = (this->m_outputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (pcVar2 != (pointer)0x0) {
      operator_delete(pcVar2);
    }
    pcVar2 = (this->m_inputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar2 != (pointer)0x0) {
      operator_delete(pcVar2);
    }
    p_Var3 = (this->m_closeCallback).super__Function_base._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      (*p_Var3)((_Any_data *)&this->m_closeCallback,(_Any_data *)&this->m_closeCallback,
                __destroy_functor);
    }
    p_Var3 = (this->m_highWaterMarkCallback).super__Function_base._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      (*p_Var3)((_Any_data *)&this->m_highWaterMarkCallback,
                (_Any_data *)&this->m_highWaterMarkCallback,__destroy_functor);
    }
    p_Var3 = (this->m_writeCompleteCallback).super__Function_base._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      (*p_Var3)((_Any_data *)&this->m_writeCompleteCallback,
                (_Any_data *)&this->m_writeCompleteCallback,__destroy_functor);
    }
    p_Var3 = (this->m_messageCallback).super__Function_base._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      (*p_Var3)((_Any_data *)&this->m_messageCallback,(_Any_data *)&this->m_messageCallback,
                __destroy_functor);
    }
    p_Var3 = (this->m_connectionCallback).super__Function_base._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      (*p_Var3)((_Any_data *)&this->m_connectionCallback,(_Any_data *)&this->m_connectionCallback,
                __destroy_functor);
    }
    std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
              (&this->m_channel);
    std::unique_ptr<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>::~unique_ptr
              (&this->m_socket);
    pcVar4 = (this->m_name)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &(this->m_name).field_2) {
      operator_delete(pcVar4);
    }
    p_Var5 = (this->super_enable_shared_from_this<sznet::net::TcpConnection>)._M_weak_this.
             super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var5->_M_weak_count;
        iVar9 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar9 = p_Var5->_M_weak_count;
        p_Var5->_M_weak_count = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (*p_Var5->_vptr__Sp_counted_base[3])();
      }
    }
    return;
  }
  __assert_fail("m_state == kDisconnected",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                ,0x3d,"sznet::net::TcpConnection::~TcpConnection()");
}

Assistant:

TcpConnection::~TcpConnection()
{
	LOG_DEBUG << "TcpConnection::dtor[" << m_name << "] at " << this
		<< " fd=" << m_channel->fd()
		<< " state=" << stateToString();
	assert(m_state == kDisconnected);
}